

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

bool __thiscall verona::lookup_type(verona *this,Node *id,initializer_list<trieste::Token> t)

{
  size_type sVar1;
  pointer this_00;
  element_type *this_01;
  bool local_99;
  _Rb_tree_const_iterator<verona::Lookup> local_88 [3];
  shared_ptr<trieste::NodeDef> local_70;
  shared_ptr<trieste::NodeDef> local_60;
  undefined1 local_50 [8];
  Lookups defs;
  Node *id_local;
  initializer_list<trieste::Token> t_local;
  
  t_local._M_array = t._M_array;
  defs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  id_local = id;
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_60,(shared_ptr<trieste::NodeDef> *)this);
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_70);
  lookup((Lookups *)local_50,&local_60,&local_70);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_70);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_60);
  sVar1 = ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::
          size((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_> *)
               local_50);
  local_99 = false;
  if (sVar1 == 1) {
    local_88[0]._M_node =
         (_Base_ptr)
         ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::
         begin((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_> *)
               local_50);
    this_00 = ::std::_Rb_tree_const_iterator<verona::Lookup>::operator->(local_88);
    this_01 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_00);
    local_99 = trieste::NodeDef::in(this_01,(initializer_list<trieste::Token> *)&id_local);
  }
  ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::~set
            ((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_> *)
             local_50);
  return local_99;
}

Assistant:

bool lookup_type(Node id, std::initializer_list<Token> t)
  {
    auto defs = lookup(id, {});
    return (defs.size() == 1) && defs.begin()->def->in(t);
  }